

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PermuteLayerParams::InternalSwap
          (PermuteLayerParams *this,PermuteLayerParams *other)

{
  PermuteLayerParams *other_local;
  PermuteLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->axis_,&other->axis_);
  return;
}

Assistant:

void PermuteLayerParams::InternalSwap(PermuteLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axis_.InternalSwap(&other->axis_);
}